

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,Option *opt)

{
  uint uVar1;
  float *pfVar2;
  Mat *in_RCX;
  long in_RSI;
  Mat *in_RDI;
  long in_R8;
  int n_9;
  int n_8;
  int n_7;
  int n_6;
  float o3 [4];
  float o2 [4];
  float o1 [4];
  float o0 [4];
  float d5_1 [4];
  float d4_1 [4];
  float d3_1 [4];
  float d2_1 [4];
  float d1_1 [4];
  float d0_1 [4];
  float w3_1 [6];
  float w2_1 [6];
  float w1_1 [6];
  float w0_1 [6];
  float s5 [6];
  float s4 [6];
  float s3 [6];
  float s2 [6];
  float s1 [6];
  float s0 [6];
  float *out_tile;
  int i_2;
  float *outRow3;
  float *outRow2;
  float *outRow1;
  float *outRow0;
  int j_1;
  float bias0;
  Mat out;
  Mat out_tm;
  int p_1;
  int nRowBlocks_2;
  int nColBlocks_2;
  int h_tm_2;
  int w_tm_2;
  Mat top_blob_bordered;
  int n_5;
  int n_4;
  float *k0;
  float *r0_1;
  int q_1;
  float sum0 [36];
  float *output0_tm;
  int i_1;
  Mat kernel0_tm;
  Mat out0_tm;
  int p;
  int tiles_1;
  int nRowBlocks_1;
  int nColBlocks_1;
  int h_tm_1;
  int w_tm_1;
  Mat top_blob_tm;
  int n_3;
  int n_2;
  int n_1;
  int n;
  float t5 [6];
  float t4 [6];
  float t3 [6];
  float t2 [6];
  float t1 [6];
  float t0 [6];
  float w5 [6];
  float w4 [6];
  float w3 [6];
  float w2 [6];
  float w1 [6];
  float w0 [6];
  float d5 [6];
  float d4 [6];
  float d3 [6];
  float d2 [6];
  float d1 [6];
  float d0 [6];
  int i;
  float *r5;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  int j;
  float *out_tm0;
  float *img;
  int q;
  int tiles;
  int nRowBlocks;
  int nColBlocks;
  int h_tm;
  int w_tm;
  Mat bottom_blob_tm;
  float *bias;
  Mat bottom_blob_bordered;
  int outch;
  int outh;
  int outw;
  int inch;
  int h;
  int w;
  Mat *m;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffff65c;
  int in_stack_fffffffffffff664;
  Mat *in_stack_fffffffffffff668;
  Mat *in_stack_fffffffffffff670;
  int local_968;
  int local_964;
  int local_960;
  int local_95c;
  float afStack_958 [4];
  float afStack_948 [4];
  float afStack_938 [4];
  float afStack_928 [4];
  float local_918 [4];
  float local_908 [4];
  float local_8f8 [4];
  float local_8e8 [4];
  float local_8d8 [4];
  float local_8c8 [4];
  float local_8b8 [8];
  float local_898 [8];
  float local_878 [8];
  float local_858 [8];
  float afStack_838 [8];
  float afStack_818 [8];
  float afStack_7f8 [8];
  float afStack_7d8 [8];
  float afStack_7b8 [8];
  float afStack_798 [8];
  float *local_778;
  int local_76c;
  float *local_768;
  float *local_760;
  float *local_758;
  float *local_750;
  int local_748;
  float local_744;
  Mat local_740;
  Mat local_700;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  int local_6b0;
  int local_6ac;
  Mat local_6a8;
  Mat local_668;
  int local_628;
  int local_624;
  float *local_620;
  Mat local_618;
  Mat *local_5d8;
  int local_5cc;
  float local_5c8 [38];
  float *local_530;
  int local_524;
  Mat local_520;
  Mat local_4e0;
  int local_4a0;
  int local_49c;
  int local_498;
  int local_494;
  int local_490;
  int local_48c;
  Mat local_488;
  Mat local_448;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  float local_3f8 [8];
  float local_3d8 [7];
  float in_stack_fffffffffffffc44;
  int in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  int in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  undefined4 in_stack_fffffffffffffc58;
  float in_stack_fffffffffffffc5c;
  Mat *in_stack_fffffffffffffc60;
  float local_398 [2];
  int in_stack_fffffffffffffc70;
  float in_stack_fffffffffffffc74;
  int in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  int in_stack_fffffffffffffc80;
  float local_378 [8];
  float local_358 [8];
  float local_338 [8];
  float local_318 [2];
  int local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined4 local_304;
  float local_2f8 [3];
  int local_2ec;
  undefined4 local_2e8;
  undefined4 local_2e4;
  float local_2d8 [2];
  int local_2d0;
  int local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  float local_2b8 [3];
  int local_2ac;
  undefined4 local_2a8;
  undefined4 local_2a4;
  float local_298 [3];
  int local_28c;
  float local_288;
  float local_284;
  float afStack_278 [8];
  float afStack_258 [8];
  float afStack_238 [8];
  float afStack_218 [8];
  float afStack_1f8 [8];
  float afStack_1d8 [7];
  int local_1bc;
  float *local_1b8;
  float *local_1b0;
  float *local_1a8;
  float *local_1a0;
  float *local_198;
  float *local_190;
  int local_184;
  Mat local_180;
  float *local_140;
  Mat local_138;
  float *local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  Mat local_d8;
  float *local_98;
  Mat local_80;
  int local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  Mat *local_20;
  
  local_2c = in_RDI->w;
  local_30 = in_RDI->h;
  local_34 = in_RDI->c;
  local_38 = *(int *)(in_RSI + 0x2c);
  local_3c = *(int *)(in_RSI + 0x30);
  local_40 = *(int *)(in_RSI + 0x34);
  local_28 = in_R8;
  local_20 = in_RCX;
  Mat::Mat(&local_80,in_RDI);
  uVar1 = local_38 + 3;
  if ((int)(local_38 + 3) < 0) {
    uVar1 = local_38 + 6;
  }
  local_38 = uVar1 & 0xfffffffc;
  uVar1 = local_3c + 3;
  if ((int)(local_3c + 3) < 0) {
    uVar1 = local_3c + 6;
  }
  local_3c = uVar1 & 0xfffffffc;
  local_2c = local_38 + 2;
  local_30 = local_3c + 2;
  m = *(Mat **)(local_28 + 0x10);
  uVar3 = *(undefined4 *)(local_28 + 4);
  copy_make_border(in_stack_fffffffffffffc60,
                   (Mat *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                   in_stack_fffffffffffffc54,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                   in_stack_fffffffffffffc48,in_stack_fffffffffffffc70,in_stack_fffffffffffffc44,
                   (Allocator *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                   in_stack_fffffffffffffc80);
  local_98 = Mat::operator_cast_to_float_(local_20);
  Mat::Mat(&local_d8);
  uVar1 = local_38;
  if ((int)local_38 < 0) {
    uVar1 = local_38 + 3;
  }
  local_dc = ((int)uVar1 >> 2) * 6;
  uVar1 = local_3c;
  if ((int)local_3c < 0) {
    uVar1 = local_3c + 3;
  }
  local_e0 = ((int)uVar1 >> 2) * 6;
  local_e4 = local_e0 / 6;
  local_e8 = local_dc / 6;
  local_ec = local_e4 * local_e8;
  Mat::create(in_stack_fffffffffffff670,(int)((ulong)in_stack_fffffffffffff668 >> 0x20),
              (int)in_stack_fffffffffffff668,in_stack_fffffffffffff664,
              CONCAT44(in_stack_fffffffffffff65c,uVar3),(Allocator *)m);
  for (local_f0 = 0; local_f0 < local_34; local_f0 = local_f0 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff65c,uVar3),(int)((ulong)m >> 0x20));
    pfVar2 = Mat::operator_cast_to_float_(&local_138);
    Mat::~Mat((Mat *)0x135603);
    local_f8 = pfVar2;
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff65c,uVar3),(int)((ulong)m >> 0x20));
    pfVar2 = Mat::operator_cast_to_float_(&local_180);
    Mat::~Mat((Mat *)0x13564f);
    local_140 = pfVar2;
    for (local_184 = 0; local_184 < local_e4; local_184 = local_184 + 1) {
      local_190 = local_f8 + local_2c * local_184 * 4;
      local_198 = local_190 + local_2c;
      local_1a0 = local_198 + local_2c;
      local_1a8 = local_1a0 + local_2c;
      local_1b0 = local_1a8 + local_2c;
      local_1b8 = local_1a8 + local_2c + local_2c;
      for (local_1bc = 0; local_1bc < local_e8; local_1bc = local_1bc + 1) {
        for (local_3fc = 0; local_3fc < 6; local_3fc = local_3fc + 1) {
          afStack_1d8[local_3fc] = local_190[local_3fc];
          afStack_1f8[local_3fc] = local_198[local_3fc];
          afStack_218[local_3fc] = local_1a0[local_3fc];
          afStack_238[local_3fc] = local_1a8[local_3fc];
          afStack_258[local_3fc] = local_1b0[local_3fc];
          afStack_278[local_3fc] = local_1b8[local_3fc];
        }
        for (local_400 = 0; local_400 < 6; local_400 = local_400 + 1) {
          local_298[local_400] =
               (afStack_1d8[local_400] * 4.0 - afStack_218[local_400] * 5.0) +
               afStack_258[local_400];
          local_2b8[local_400] =
               (afStack_1f8[local_400] * -4.0 - afStack_218[local_400] * 4.0) +
               afStack_238[local_400] + afStack_258[local_400];
          local_2d8[local_400] =
               ((afStack_1f8[local_400] * 4.0 - afStack_218[local_400] * 4.0) -
               afStack_238[local_400]) + afStack_258[local_400];
          local_2f8[local_400] =
               (afStack_1f8[local_400] * -2.0 - afStack_218[local_400]) +
               afStack_238[local_400] * 2.0 + afStack_258[local_400];
          local_318[local_400] =
               ((afStack_1f8[local_400] * 2.0 - afStack_218[local_400]) -
               afStack_238[local_400] * 2.0) + afStack_258[local_400];
          local_338[local_400] =
               (afStack_1f8[local_400] * 4.0 - afStack_238[local_400] * 5.0) +
               afStack_278[local_400];
        }
        local_358[0] = local_298[0];
        local_378[0] = local_298[1];
        local_398[0] = local_298[2];
        local_3d8[0] = local_288;
        local_3f8[0] = local_284;
        local_358[1] = local_2b8[0];
        local_378[1] = local_2b8[1];
        local_398[1] = local_2b8[2];
        local_3d8[1] = (float)local_2a8;
        local_3f8[1] = (float)local_2a4;
        local_358[2] = local_2d8[0];
        local_378[2] = local_2d8[1];
        local_3d8[2] = (float)local_2c8;
        local_3f8[2] = (float)local_2c4;
        local_358[3] = local_2f8[0];
        local_378[3] = local_2f8[1];
        local_3d8[3] = (float)local_2e8;
        local_3f8[3] = (float)local_2e4;
        local_358[4] = local_318[0];
        local_378[4] = local_318[1];
        local_3d8[4] = (float)local_308;
        local_3f8[4] = (float)local_304;
        local_358[5] = local_338[0];
        local_378[5] = local_338[1];
        local_3d8[5] = local_338[4];
        local_3f8[5] = local_338[5];
        for (local_404 = 0; local_404 < 6; local_404 = local_404 + 1) {
          afStack_1d8[local_404] =
               (local_358[local_404] * 4.0 - local_398[local_404] * 5.0) + local_3d8[local_404];
          afStack_1f8[local_404] =
               (local_378[local_404] * -4.0 - local_398[local_404] * 4.0) +
               local_398[(long)local_404 + -8] + local_3d8[local_404];
          afStack_218[local_404] =
               ((local_378[local_404] * 4.0 - local_398[local_404] * 4.0) -
               local_398[(long)local_404 + -8]) + local_3d8[local_404];
          afStack_238[local_404] =
               (local_378[local_404] * -2.0 - local_398[local_404]) +
               local_398[(long)local_404 + -8] * 2.0 + local_3d8[local_404];
          afStack_258[local_404] =
               ((local_378[local_404] * 2.0 - local_398[local_404]) -
               local_398[(long)local_404 + -8] * 2.0) + local_3d8[local_404];
          afStack_278[local_404] =
               (local_378[local_404] * 4.0 - local_398[(long)local_404 + -8] * 5.0) +
               local_3f8[local_404];
        }
        for (local_408 = 0; local_408 < 6; local_408 = local_408 + 1) {
          local_140[local_408] = afStack_1d8[local_408];
          local_140[local_408 + 6] = afStack_1f8[local_408];
          local_140[local_408 + 0xc] = afStack_218[local_408];
          local_140[local_408 + 0x12] = afStack_238[local_408];
          local_140[local_408 + 0x18] = afStack_258[local_408];
          local_140[local_408 + 0x1e] = afStack_278[local_408];
        }
        local_190 = local_190 + 4;
        local_198 = local_198 + 4;
        local_1a0 = local_1a0 + 4;
        local_1a8 = local_1a8 + 4;
        local_1b0 = local_1b0 + 4;
        local_1b8 = local_1b8 + 4;
        local_140 = local_140 + 0x24;
        in_stack_fffffffffffffc48 = local_28c;
        in_stack_fffffffffffffc4c = local_2ac;
        in_stack_fffffffffffffc50 = local_2cc;
        in_stack_fffffffffffffc54 = local_2ec;
        in_stack_fffffffffffffc58 = local_30c;
        in_stack_fffffffffffffc5c = local_338[3];
        in_stack_fffffffffffffc70 = local_2d0;
        in_stack_fffffffffffffc74 = local_2f8[2];
        in_stack_fffffffffffffc78 = local_310;
      }
    }
  }
  Mat::Mat(&local_448);
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff65c,uVar3),m);
  Mat::~Mat((Mat *)0x1362b3);
  Mat::Mat(&local_488);
  uVar1 = local_38;
  if ((int)local_38 < 0) {
    uVar1 = local_38 + 3;
  }
  local_48c = ((int)uVar1 >> 2) * 6;
  uVar1 = local_3c;
  if ((int)local_3c < 0) {
    uVar1 = local_3c + 3;
  }
  local_490 = ((int)uVar1 >> 2) * 6;
  local_494 = local_490 / 6;
  local_498 = local_48c / 6;
  local_49c = local_494 * local_498;
  Mat::create(in_stack_fffffffffffff670,(int)((ulong)in_stack_fffffffffffff668 >> 0x20),
              (int)in_stack_fffffffffffff668,in_stack_fffffffffffff664,
              CONCAT44(in_stack_fffffffffffff65c,uVar3),(Allocator *)m);
  for (local_4a0 = 0; local_4a0 < local_40; local_4a0 = local_4a0 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff65c,uVar3),(int)((ulong)m >> 0x20));
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff65c,uVar3),(int)((ulong)m >> 0x20));
    for (local_524 = 0; local_524 < local_49c; local_524 = local_524 + 1) {
      local_530 = Mat::row(&local_4e0,local_524);
      memset(local_5c8,0,0x90);
      for (local_5cc = 0; local_5cc < local_34; local_5cc = local_5cc + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff65c,uVar3),(int)((ulong)m >> 0x20));
        in_stack_fffffffffffff668 = &local_618;
        in_stack_fffffffffffff670 = (Mat *)Mat::row(in_stack_fffffffffffff668,local_524);
        Mat::~Mat((Mat *)0x1364a7);
        local_5d8 = in_stack_fffffffffffff670;
        local_620 = Mat::row(&local_520,local_5cc);
        for (local_624 = 0; local_624 < 0x24; local_624 = local_624 + 1) {
          local_5c8[local_624] =
               *(float *)((long)&local_5d8->data + (long)local_624 * 4) * local_620[local_624] +
               local_5c8[local_624];
        }
      }
      for (local_628 = 0; local_628 < 0x24; local_628 = local_628 + 1) {
        local_530[local_628] = local_5c8[local_628];
      }
    }
    Mat::~Mat((Mat *)0x136655);
    Mat::~Mat((Mat *)0x136662);
  }
  Mat::Mat(&local_668);
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff65c,uVar3),m);
  Mat::~Mat((Mat *)0x1366bd);
  Mat::Mat(&local_6a8);
  Mat::create(in_stack_fffffffffffff670,(int)((ulong)in_stack_fffffffffffff668 >> 0x20),
              (int)in_stack_fffffffffffff668,in_stack_fffffffffffff664,
              CONCAT44(in_stack_fffffffffffff65c,uVar3),(Allocator *)m);
  local_6ac = ((int)local_38 / 4) * 6;
  local_6b0 = ((int)local_3c / 4) * 6;
  local_6b4 = local_6b0 / 6;
  local_6b8 = local_6ac / 6;
  for (local_6bc = 0; local_6bc < local_40; local_6bc = local_6bc + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff65c,uVar3),(int)((ulong)m >> 0x20));
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff65c,uVar3),(int)((ulong)m >> 0x20));
    if (local_98 == (float *)0x0) {
      local_744 = 0.0;
    }
    else {
      local_744 = local_98[local_6bc];
    }
    for (local_748 = 0; local_748 < local_6b4; local_748 = local_748 + 1) {
      local_750 = Mat::row(&local_740,local_748 << 2);
      local_758 = Mat::row(&local_740,local_748 * 4 + 1);
      local_760 = Mat::row(&local_740,local_748 * 4 + 2);
      local_768 = Mat::row(&local_740,local_748 * 4 + 3);
      for (local_76c = 0; local_76c < local_6b8; local_76c = local_76c + 1) {
        local_778 = Mat::row(&local_700,local_748 * local_6b8 + local_76c);
        for (local_95c = 0; local_95c < 6; local_95c = local_95c + 1) {
          afStack_798[local_95c] = local_778[local_95c];
          afStack_7b8[local_95c] = local_778[local_95c + 6];
          afStack_7d8[local_95c] = local_778[local_95c + 0xc];
          afStack_7f8[local_95c] = local_778[local_95c + 0x12];
          afStack_818[local_95c] = local_778[local_95c + 0x18];
          afStack_838[local_95c] = local_778[local_95c + 0x1e];
        }
        for (local_960 = 0; local_960 < 6; local_960 = local_960 + 1) {
          local_858[local_960] =
               afStack_798[local_960] + afStack_7b8[local_960] + afStack_7d8[local_960] +
               afStack_7f8[local_960] + afStack_818[local_960];
          local_878[local_960] =
               ((afStack_7b8[local_960] - afStack_7d8[local_960]) + afStack_7f8[local_960] * 2.0) -
               afStack_818[local_960] * 2.0;
          local_898[local_960] =
               afStack_7b8[local_960] + afStack_7d8[local_960] + afStack_7f8[local_960] * 4.0 +
               afStack_818[local_960] * 4.0;
          local_8b8[local_960] =
               (((afStack_7b8[local_960] - afStack_7d8[local_960]) + afStack_7f8[local_960] * 8.0) -
               afStack_818[local_960] * 8.0) + afStack_838[local_960];
        }
        local_8c8[0] = local_858[0];
        local_8c8[1] = local_878[0];
        local_8c8[2] = local_898[0];
        local_8c8[3] = local_8b8[0];
        local_8d8[0] = local_858[1];
        local_8d8[1] = local_878[1];
        local_8d8[2] = local_898[1];
        local_8d8[3] = local_8b8[1];
        local_8e8[0] = local_858[2];
        local_8e8[1] = local_878[2];
        local_8e8[2] = local_898[2];
        local_8e8[3] = local_8b8[2];
        local_8f8[0] = local_858[3];
        local_8f8[1] = local_878[3];
        local_8f8[2] = local_898[3];
        local_8f8[3] = local_8b8[3];
        local_908[0] = local_858[4];
        local_908[1] = local_878[4];
        local_908[2] = local_898[4];
        local_908[3] = local_8b8[4];
        local_918[0] = local_858[5];
        local_918[1] = local_878[5];
        local_918[2] = local_898[5];
        local_918[3] = local_8b8[5];
        for (local_964 = 0; local_964 < 4; local_964 = local_964 + 1) {
          afStack_928[local_964] =
               local_8c8[local_964] + local_8d8[local_964] + local_8e8[local_964] +
               local_8f8[local_964] + local_908[local_964] + local_744;
          afStack_938[local_964] =
               (((local_8d8[local_964] - local_8e8[local_964]) + local_8f8[local_964] * 2.0) -
               local_908[local_964] * 2.0) + local_744;
          afStack_948[local_964] =
               local_8d8[local_964] + local_8e8[local_964] + local_8f8[local_964] * 4.0 +
               local_908[local_964] * 4.0 + local_744;
          afStack_958[local_964] =
               (((local_8d8[local_964] - local_8e8[local_964]) + local_8f8[local_964] * 8.0) -
               local_908[local_964] * 8.0) + local_918[local_964] + local_744;
        }
        for (local_968 = 0; local_968 < 4; local_968 = local_968 + 1) {
          local_750[local_968] = afStack_928[local_968];
          local_758[local_968] = afStack_938[local_968];
          local_760[local_968] = afStack_948[local_968];
          local_768[local_968] = afStack_958[local_968];
        }
        local_750 = local_750 + 4;
        local_758 = local_758 + 4;
        local_760 = local_760 + 4;
        local_768 = local_768 + 4;
      }
    }
    Mat::~Mat((Mat *)0x137080);
    Mat::~Mat((Mat *)0x13708d);
  }
  copy_cut_border(in_stack_fffffffffffffc60,
                  (Mat *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                  in_stack_fffffffffffffc54,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                  in_stack_fffffffffffffc48,
                  (Allocator *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                  in_stack_fffffffffffffc78);
  Mat::~Mat((Mat *)0x1370ff);
  Mat::~Mat((Mat *)0x13710c);
  Mat::~Mat((Mat *)0x137119);
  Mat::~Mat((Mat *)0x137126);
  return;
}

Assistant:

static void conv3x3s1_winograd43_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2, winograd F(4,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt.workspace_allocator, opt.num_threads);

    const float* bias = _bias;    

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(6*6, tiles, inch, 4u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
        //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
        //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
        //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
        // };

		// 0 =	4 * r00  - 5 * r02	+ r04
        // 1 = -4 * (r01 + r02)  + r03 + r04
        // 2 =	4 * (r01 - r02)  - r03 + r04
        // 3 = -2 * r01 - r02 + 2 * r03 + r04
        // 4 =	2 * r01 - r02 - 2 * r03 + r04
		// 5 =	4 * r01 - 5 * r03 + r05

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const float* img = bottom_blob_bordered.channel(q);
            float* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const float* r0 = img + w * j * 4;
                const float* r1 = r0 + w;
                const float* r2 = r1 + w;
                const float* r3 = r2 + w;
                const float* r4 = r3 + w;
                const float* r5 = r4 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    float d0[6],d1[6],d2[6],d3[6],d4[6],d5[6];
                    float w0[6],w1[6],w2[6],w3[6],w4[6],w5[6];
                    float t0[6],t1[6],t2[6],t3[6],t4[6],t5[6];

                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                        d4[n] = r4[n];
                        d5[n] = r5[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 6; n++)
                    {   
                        w0[n] =  4*d0[n]          - 5*d2[n]           + d4[n];
                        w1[n] =          -4*d1[n] - 4*d2[n] +   d3[n] + d4[n];
                        w2[n] =           4*d1[n] - 4*d2[n] -   d3[n] + d4[n];
                        w3[n] =          -2*d1[n] -   d2[n] + 2*d3[n] + d4[n];
                        w4[n] =           2*d1[n] -   d2[n] - 2*d3[n] + d4[n];
                        w5[n] =           4*d1[n]           - 5*d3[n]          + d5[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3]; t4[0]=w0[4]; t5[0]=w0[5];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3]; t4[1]=w1[4]; t5[1]=w1[5];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3]; t4[2]=w2[4]; t5[2]=w2[5];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3]; t4[3]=w3[4]; t5[3]=w3[5];
                        t0[4]=w4[0]; t1[4]=w4[1]; t2[4]=w4[2]; t3[4]=w4[3]; t4[4]=w4[4]; t5[4]=w4[5];
                        t0[5]=w5[0]; t1[5]=w5[1]; t2[5]=w5[2]; t3[5]=w5[3]; t4[5]=w5[4]; t5[5]=w5[5];
                    }                   
                    // d = B_t * d_t
                    for (int n = 0; n < 6; n++)
                    {   
                        d0[n] =  4*t0[n]           - 5*t2[n]           + t4[n];
                        d1[n] =          - 4*t1[n] - 4*t2[n] +   t3[n] + t4[n];
                        d2[n] =            4*t1[n] - 4*t2[n] -   t3[n] + t4[n];
                        d3[n] =          - 2*t1[n] -   t2[n] + 2*t3[n] + t4[n];
                        d4[n] =            2*t1[n] -   t2[n] - 2*t3[n] + t4[n];
                        d5[n] =            4*t1[n]           - 5*t3[n]          + t5[n];
                    }                   
                    // save to out_tm
                    for (int n = 0; n < 6; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 6] = d1[n];
                        out_tm0[n+12] = d2[n];
                        out_tm0[n+18] = d3[n];
                        out_tm0[n+24] = d4[n];
                        out_tm0[n+30] = d5[n];
                    }

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    r3 += 4;
                    r4 += 4;
                    r5 += 4;

                    out_tm0 += 36;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(36, tiles, outch, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                float* output0_tm = out0_tm.row(i);

                float sum0[36] = {0.0f};

                for (int q=0; q<inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* k0 = kernel0_tm.row(q);

                    for (int n=0; n<36; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                    }                                
                }                  

                for (int n=0; n<36; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[4][6] = {
        //     {1.0f, 1.0f,  1.0f, 1.0f,  1.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 2.0f, -2.0f, 0.0f},
        //     {0.0f, 1.0f,  1.0f, 4.0f,  4.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 8.0f, -8.0f, 1.0f}
        // };

        // 0 =	r00 + r01 + r02 + r03 +	r04
        // 1 =		  r01 - r02 + 2 * (r03 - r04)
        // 2 =		  r01 + r02 + 4 * (r03 + r04)
        // 3 =		  r01 - r02 + 8 * (r03 - r04)  + r05
        

        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            const float bias0 = bias ? bias[p] : 0.f;

            for (int j=0; j<nColBlocks; j++)
            {
                float* outRow0 = out.row(j*4);
                float* outRow1 = out.row(j*4+1);
                float* outRow2 = out.row(j*4+2);
                float* outRow3 = out.row(j*4+3);                

                for(int i=0; i<nRowBlocks; i++)
                {
                    float* out_tile = out_tm.row(j*nRowBlocks + i);

                    float s0[6],s1[6],s2[6],s3[6],s4[6],s5[6];
                    float w0[6],w1[6],w2[6],w3[6];
                    float d0[4],d1[4],d2[4],d3[4],d4[4],d5[4];
                    float o0[4],o1[4],o2[4],o3[4];
                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 6];
                        s2[n] = out_tile[n+12];
                        s3[n] = out_tile[n+18];
                        s4[n] = out_tile[n+24];
                        s5[n] = out_tile[n+30];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 6; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n] +   s3[n] +   s4[n];
                        w1[n] =         s1[n] - s2[n] + 2*s3[n] - 2*s4[n];
                        w2[n] =         s1[n] + s2[n] + 4*s3[n] + 4*s4[n];
                        w3[n] =         s1[n] - s2[n] + 8*s3[n] - 8*s4[n] + s5[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0]; d0[2] = w2[0]; d0[3] = w3[0];
                        d1[0] = w0[1]; d1[1] = w1[1]; d1[2] = w2[1]; d1[3] = w3[1];
                        d2[0] = w0[2]; d2[1] = w1[2]; d2[2] = w2[2]; d2[3] = w3[2];
                        d3[0] = w0[3]; d3[1] = w1[3]; d3[2] = w2[3]; d3[3] = w3[3];
                        d4[0] = w0[4]; d4[1] = w1[4]; d4[2] = w2[4]; d4[3] = w3[4];
                        d5[0] = w0[5]; d5[1] = w1[5]; d5[2] = w2[5]; d5[3] = w3[5];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 4; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n] +   d3[n] +   d4[n]         + bias0;
                        o1[n] =         d1[n] - d2[n] + 2*d3[n] - 2*d4[n]         + bias0;
                        o2[n] =         d1[n] + d2[n] + 4*d3[n] + 4*d4[n]         + bias0;
                        o3[n] =         d1[n] - d2[n] + 8*d3[n] - 8*d4[n] + d5[n] + bias0;
                    }
                    // save to top blob tm
                    for (int n = 0; n < 4; n++)
                    {
                        outRow0[n] = o0[n];
                        outRow1[n] = o1[n];
                        outRow2[n] = o2[n];
                        outRow3[n] = o3[n];
                    }                    

                    outRow0 += 4;
                    outRow1 += 4;   
                    outRow2 += 4;
                    outRow3 += 4;                        
                }
            }
        }        
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt.blob_allocator, opt.num_threads);
}